

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

void flatview_add_to_dispatch_sparc
               (uc_struct_conflict8 *uc,FlatView *fv,MemoryRegionSection *section)

{
  long lVar1;
  ulong uVar2;
  undefined1 a [16];
  undefined1 a_00 [16];
  undefined1 a_01 [16];
  undefined1 a_02 [16];
  undefined1 a_03 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  uint16_t leaf;
  MemoryRegionSection *extraout_RDX;
  MemoryRegionSection *extraout_RDX_00;
  ulong uVar5;
  ulong uVar6;
  FlatRange *pFVar7;
  ulong uVar8;
  MemoryRegionSection remain;
  MemoryRegionSection now;
  undefined1 in_stack_ffffffffffffff18 [14];
  undefined2 in_stack_ffffffffffffff26;
  undefined1 local_d8 [24];
  MemoryRegionSection *pMStack_c0;
  MemoryRegion *local_b8;
  ulong uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uc_struct_conflict8 *local_98;
  AddressSpaceDispatch *local_90;
  ulong local_88;
  FlatRange *local_80;
  undefined1 local_78 [24];
  MemoryRegionSection *pMStack_60;
  MemoryRegion *local_58;
  hwaddr hStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar6 = (ulong)section->size;
  pFVar7 = *(FlatRange **)((long)&section->size + 8);
  local_d8._16_8_ = section->mr;
  pMStack_c0 = (MemoryRegionSection *)section->fv;
  local_b8 = (MemoryRegion *)section->offset_within_region;
  uVar5 = section->offset_within_address_space;
  local_a8 = *(undefined8 *)&section->readonly;
  uStack_a0 = *(undefined8 *)&section->field_0x38;
  local_d8._0_8_ = uVar6;
  local_d8._8_8_ = pFVar7;
  uStack_b0 = uVar5;
  if ((uVar5 & 0xfff) != 0) {
    uVar8 = (uVar5 + 0xfff & 0xfffffffffffff000) - uVar5;
    uVar2 = (ulong)section->size;
    pFVar7 = *(FlatRange **)((long)&section->size + 8);
    local_78._16_8_ = section->mr;
    pMStack_60 = (MemoryRegionSection *)section->fv;
    local_58 = (MemoryRegion *)section->offset_within_region;
    hStack_50 = section->offset_within_address_space;
    local_48 = *(undefined8 *)&section->readonly;
    uStack_40 = *(undefined8 *)&section->field_0x38;
    uVar6 = (ulong)(uVar8 < uVar2);
    lVar1 = -(long)pFVar7;
    if (lVar1 < (long)uVar6) {
      pFVar7 = (FlatRange *)0x0;
      uVar2 = uVar8;
    }
    local_78._0_8_ = uVar2;
    local_78._8_8_ = pFVar7;
    register_subpage((uc_struct_conflict8 *)fv,(FlatView *)local_78,
                     (MemoryRegionSection *)(lVar1 - uVar6));
    if ((FlatRange *)local_d8._8_8_ == pFVar7 && local_d8._0_8_ == uVar2) {
      return;
    }
    uVar6 = local_d8._0_8_ - uVar2;
    pFVar7 = (FlatRange *)
             (local_d8._8_8_ + (-(ulong)((ulong)local_d8._0_8_ < uVar2) - (long)pFVar7));
    a._14_2_ = in_stack_ffffffffffffff26;
    a._0_14_ = in_stack_ffffffffffffff18;
    local_d8._0_8_ = uVar6;
    local_d8._8_8_ = pFVar7;
    int128_get64((Int128)a);
    uVar5 = uVar5 + uVar2;
    a_00._14_2_ = in_stack_ffffffffffffff26;
    a_00._0_14_ = in_stack_ffffffffffffff18;
    uStack_b0 = uVar5;
    int128_get64((Int128)a_00);
    local_b8 = (MemoryRegion *)(&local_b8->ram + uVar2);
    section = extraout_RDX;
  }
  uVar2 = uStack_b0;
  uVar4 = local_d8._8_8_;
  uVar3 = local_d8._0_8_;
  if ((long)(ulong)(uVar6 < 0x1000) <= (long)pFVar7) {
    local_78._8_8_ = local_d8._8_8_;
    local_48 = local_a8;
    uStack_40 = uStack_a0;
    local_58 = local_b8;
    hStack_50 = uStack_b0;
    local_78._16_8_ = local_d8._16_8_;
    pMStack_60 = pMStack_c0;
    local_88 = local_d8._0_8_ & 0xfffffffffffff000;
    local_90 = fv->dispatch;
    local_98 = (uc_struct_conflict8 *)fv;
    local_78._0_8_ = local_88;
    leaf = phys_section_add((uc_struct_conflict8 *)&local_90->map,(PhysPageMap *)local_78,section);
    uVar8 = (ulong)uVar3 >> 0xc | uVar4 << 0x34;
    local_80 = (FlatRange *)uVar4;
    a_01._14_2_ = leaf;
    a_01._0_14_ = in_stack_ffffffffffffff18;
    int128_get64((Int128)a_01);
    if (uVar8 == 0) {
      __assert_fail("num_pages",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x38d,
                    "void register_multipage(struct uc_struct *, FlatView *, MemoryRegionSection *)"
                   );
    }
    phys_page_set(local_90,uVar2 >> 0xc,uVar8,leaf);
    uVar2 = local_88;
    if (pFVar7 == local_80 && uVar6 == local_88) {
      return;
    }
    local_d8._0_8_ = uVar6 - local_88;
    local_d8._8_8_ = (long)pFVar7 + (-(ulong)(uVar6 < local_88) - (long)local_80);
    a_02._14_2_ = leaf;
    a_02._0_14_ = in_stack_ffffffffffffff18;
    int128_get64((Int128)a_02);
    uStack_b0 = uVar5 + uVar2;
    a_03._14_2_ = leaf;
    a_03._0_14_ = in_stack_ffffffffffffff18;
    int128_get64((Int128)a_03);
    local_b8 = (MemoryRegion *)(&local_b8->ram + uVar2);
    section = extraout_RDX_00;
    fv = (FlatView *)local_98;
  }
  register_subpage((uc_struct_conflict8 *)fv,(FlatView *)local_d8,section);
  return;
}

Assistant:

void flatview_add_to_dispatch(struct uc_struct *uc, FlatView *fv, MemoryRegionSection *section)
{
    MemoryRegionSection remain = *section;
    Int128 page_size = int128_make64(TARGET_PAGE_SIZE);

    /* register first subpage */
    if (remain.offset_within_address_space & ~TARGET_PAGE_MASK) {
        uint64_t left = TARGET_PAGE_ALIGN(remain.offset_within_address_space)
                        - remain.offset_within_address_space;

        MemoryRegionSection now = remain;
        now.size = int128_min(int128_make64(left), now.size);
        register_subpage(uc, fv, &now);
        if (int128_eq(remain.size, now.size)) {
            return;
        }
        remain.size = int128_sub(remain.size, now.size);
        remain.offset_within_address_space += int128_get64(now.size);
        remain.offset_within_region += int128_get64(now.size);
    }

    /* register whole pages */
    if (int128_ge(remain.size, page_size)) {
        MemoryRegionSection now = remain;
        now.size = int128_and(now.size, int128_neg(page_size));
        register_multipage(uc, fv, &now);
        if (int128_eq(remain.size, now.size)) {
            return;
        }
        remain.size = int128_sub(remain.size, now.size);
        remain.offset_within_address_space += int128_get64(now.size);
        remain.offset_within_region += int128_get64(now.size);
    }

    /* register last subpage */
    register_subpage(uc, fv, &remain);
}